

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergepatch.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::mergepatch::
from_diff<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (mergepatch *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *source
          ,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *target)

{
  bool bVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *extraout_RDX;
  value_type *rhs;
  byte bVar5;
  value_type *pvVar6;
  const_object_iterator cVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  string_view_type local_a8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_98;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_90;
  const_object_range_type local_88;
  const_object_range_type local_68;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_48;
  mergepatch local_40 [16];
  
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(source);
  if ((bVar2) &&
     (bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(target),
     bVar2)) {
    pvVar4 = operator_new(0x20);
    *(undefined8 *)((long)pvVar4 + 8) = 0;
    *(undefined8 *)((long)pvVar4 + 0x10) = 0;
    *(undefined8 *)((long)pvVar4 + 0x18) = 0;
    *(undefined2 *)this = 0xd;
    *(void **)(this + 8) = pvVar4;
    local_48 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)source;
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_68,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)source);
    bVar1 = local_68.first_.has_value_;
    local_90 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT71(local_90._1_7_,local_68.last_.has_value_);
    bVar5 = local_68.first_.has_value_ & local_68.last_.has_value_;
    local_98 = local_68.last_.it_._M_current;
    bVar2 = local_68.first_.has_value_ == local_68.last_.has_value_;
    if ((bVar5 & 1) != 0) {
      bVar2 = local_68.first_.it_._M_current == local_68.last_.it_._M_current;
    }
    if (!bVar2) {
      pvVar6 = &(local_68.first_.it_._M_current)->value_;
      do {
        local_88.first_._8_8_ =
             *(undefined8 *)
              &((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(pvVar6 + -2))->key_;
        local_88.first_.it_._M_current =
             (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)(((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                   *)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)(pvVar6 + -2))->key_)->int64_).val_;
        cVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                          ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target,
                           (string_view_type *)&local_88);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  (&local_88,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target
                  );
        if ((((undefined1  [16])cVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_88.last_.has_value_ & 1U) == 0)) {
          if (cVar7.has_value_ != local_88.last_.has_value_) goto LAB_0038f1d0;
LAB_0038f22d:
          local_a8._M_str =
               *(char **)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                            *)(pvVar6 + -2))->key_;
          local_a8._M_len =
               (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                  *)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(pvVar6 + -2))->key_)->int64_).val_;
          args = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&local_88,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,&local_a8
                     ,args);
        }
        else {
          if (cVar7.it_._M_current._M_current == local_88.last_.it_._M_current) goto LAB_0038f22d;
LAB_0038f1d0:
          rhs = &(cVar7.it_._M_current._M_current)->value_;
          iVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                            (pvVar6,rhs);
          if (iVar3 != 0) {
            local_a8._M_str =
                 *(char **)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                              *)(pvVar6 + -2))->key_;
            local_a8._M_len =
                 (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                    *)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                         *)(pvVar6 + -2))->key_)->int64_).val_;
            from_diff<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      (local_40,pvVar6,rhs);
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&local_88,
                       (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                       &local_a8,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40)
            ;
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40)
            ;
          }
        }
        bVar2 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(pvVar6 + 1) == local_98;
        if ((bVar5 & 1) == 0) {
          bVar2 = bVar1 == (bool)(byte)local_90;
        }
        pvVar6 = pvVar6 + 3;
      } while (!bVar2);
    }
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_68,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target);
    this_00 = local_48;
    local_98 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT71(local_98._1_7_,local_68.last_.has_value_);
    local_90 = local_68.last_.it_._M_current;
    bVar2 = local_68.first_.has_value_ == local_68.last_.has_value_;
    if ((local_68.first_.has_value_ & local_68.last_.has_value_ & 1U) != 0) {
      bVar2 = local_68.first_.it_._M_current == local_68.last_.it_._M_current;
    }
    if (!bVar2) {
      pvVar6 = &(local_68.first_.it_._M_current)->value_;
      do {
        local_88.first_._8_8_ =
             *(undefined8 *)
              &((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(pvVar6 + -2))->key_;
        local_88.first_.it_._M_current =
             (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)(((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                   *)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        *)(pvVar6 + -2))->key_)->int64_).val_;
        cVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                          (this_00,(string_view_type *)&local_88);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  (&local_88,this_00);
        if ((((undefined1  [16])cVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_88.last_.has_value_ & 1U) == 0)) {
          if (cVar7.has_value_ == local_88.last_.has_value_) goto LAB_0038f32f;
        }
        else if (cVar7.it_._M_current._M_current == local_88.last_.it_._M_current) {
LAB_0038f32f:
          local_a8._M_str =
               *(char **)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                            *)(pvVar6 + -2))->key_;
          local_a8._M_len =
               (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                  *)&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(pvVar6 + -2))->key_)->int64_).val_;
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)&local_88,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,&local_a8
                     ,pvVar6);
        }
        bVar2 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(pvVar6 + 1) == local_90;
        if ((local_68.first_.has_value_ & local_68.last_.has_value_ & 1U) == 0) {
          bVar2 = local_68.first_.has_value_ == (bool)(byte)local_98;
        }
        local_68.last_.it_._M_current =
             (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)(ulong)bVar2;
        pvVar6 = pvVar6 + 3;
      } while (bVar2 == false);
    }
  }
  else {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,target);
    local_68.last_.it_._M_current = extraout_RDX;
  }
  bVar8.field_0.int64_.val_ = (int64_t)local_68.last_.it_._M_current;
  bVar8.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar8.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target)
    {
        if (!source.is_object() || !target.is_object())
        {
            return target;
        }
        Json result(json_object_arg);

        for (const auto& member : source.object_range())
        {
            auto it = target.find(member.key());
            if (it != target.object_range().end())
            {
                if (member.value() != (*it).value())
                {
                    result.try_emplace(member.key(), from_diff(member.value(), (*it).value()));
                }
            }
            else
            {
                result.try_emplace(member.key(), Json::null());
            }
        }

        for (const auto& member : target.object_range())
        {
            auto it = source.find(member.key());
            if (it == source.object_range().end())
            {
                result.try_emplace(member.key(), member.value());
            }
        }

        return result;
    }